

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int oldParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  undefined4 *puVar2;
  long lVar3;
  char *r1;
  uint local_44;
  int res;
  char *temp;
  xmlDocPtr doc;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  nb_tests = nb_tests + 1;
  puVar2 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar2 = 0;
  lVar3 = xmlParseFile(filename);
  puVar2 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar2 = 1;
  if (lVar3 == 0) {
    filename_local._4_4_ = 1;
  }
  else {
    r1 = resultFilename(filename,temp_directory,".res");
    if (r1 == (char *)0x0) {
      fprintf(_stderr,"out of memory\n");
      fatalError();
    }
    xmlSaveFile(r1,lVar3);
    iVar1 = compareFiles(r1,result);
    local_44 = (uint)(iVar1 != 0);
    xmlFreeDoc(lVar3);
    puVar2 = (undefined4 *)__xmlGetWarningsDefaultValue();
    *puVar2 = 0;
    lVar3 = xmlParseFile(r1);
    puVar2 = (undefined4 *)__xmlGetWarningsDefaultValue();
    *puVar2 = 1;
    if (lVar3 == 0) {
      filename_local._4_4_ = 1;
    }
    else {
      xmlSaveFile(r1,lVar3);
      iVar1 = compareFiles(r1,result);
      if (iVar1 != 0) {
        local_44 = 1;
      }
      xmlFreeDoc(lVar3);
      if (r1 != (char *)0x0) {
        unlink(r1);
        free(r1);
      }
      filename_local._4_4_ = local_44;
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int
oldParseTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED,
	     int options ATTRIBUTE_UNUSED) {
    xmlDocPtr doc;
    char *temp;
    int res = 0;

    nb_tests++;
    /*
     * base of the test, parse with the old API
     */
#ifdef LIBXML_SAX1_ENABLED
    xmlGetWarningsDefaultValue = 0;
    doc = xmlParseFile(filename);
    xmlGetWarningsDefaultValue = 1;
#else
    doc = xmlReadFile(filename, NULL, XML_PARSE_NOWARNING);
#endif
    if (doc == NULL)
        return(1);
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "out of memory\n");
        fatalError();
    }
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    /*
     * Parse the saved result to make sure the round trip is okay
     */
#ifdef LIBXML_SAX1_ENABLED
    xmlGetWarningsDefaultValue = 0;
    doc = xmlParseFile(temp);
    xmlGetWarningsDefaultValue = 1;
#else
    doc = xmlReadFile(temp, NULL, XML_PARSE_NOWARNING);
#endif
    if (doc == NULL)
        return(1);
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(res);
}